

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::Model::ByteSizeLong(Model *this)

{
  uint32 uVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (this->description_ == (ModelDescription *)0x0 || this == (Model *)&_Model_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ModelDescription>(this->description_);
    sVar2 = sVar2 + 1;
  }
  if (this->specificationversion_ != 0) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->specificationversion_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  sVar3 = sVar2 + 2;
  if (this->isupdatable_ == false) {
    sVar3 = sVar2;
  }
  uVar1 = this->_oneof_case_[0];
  switch(uVar1) {
  case 600:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::OneHotEncoder>((this->Type_).onehotencoder_)
    ;
    break;
  case 0x259:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Imputer>((this->Type_).imputer_);
    break;
  case 0x25a:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::FeatureVectorizer>
                      ((this->Type_).featurevectorizer_);
    break;
  case 0x25b:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DictVectorizer>
                      ((this->Type_).dictvectorizer_);
    break;
  case 0x25c:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Scaler>((this->Type_).scaler_);
    break;
  case 0x25d:
  case 0x260:
    goto switchD_004dcdbf_caseD_25d;
  case 0x25e:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::CategoricalMapping>
                      ((this->Type_).categoricalmapping_);
    break;
  case 0x25f:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Normalizer>((this->Type_).normalizer_);
    break;
  case 0x261:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ArrayFeatureExtractor>
                      ((this->Type_).arrayfeatureextractor_);
    break;
  case 0x262:
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NonMaximumSuppression>
                      ((this->Type_).nonmaximumsuppression_);
    break;
  default:
    switch(uVar1) {
    case 2000:
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::TextClassifier>
                        ((this->Type_).textclassifier_);
      break;
    case 0x7d1:
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::WordTagger>
                        ((this->Type_).wordtagger_);
      break;
    case 0x7d2:
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::VisionFeaturePrint>
                        ((this->Type_).visionfeatureprint_);
      break;
    case 0x7d3:
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing>
                        ((this->Type_).soundanalysispreprocessing_);
      break;
    case 0x7d4:
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::Gazetteer>
                        ((this->Type_).gazetteer_);
      break;
    case 0x7d5:
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::WordEmbedding>
                        ((this->Type_).wordembedding_);
      break;
    default:
      switch(uVar1) {
      case 300:
        sVar2 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::GLMRegressor>
                          ((this->Type_).glmregressor_);
        break;
      case 0x12d:
        sVar2 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::SupportVectorRegressor>
                          ((this->Type_).supportvectorregressor_);
        break;
      case 0x12e:
        sVar2 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleRegressor>
                          ((this->Type_).treeensembleregressor_);
        break;
      case 0x12f:
        sVar2 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkRegressor>
                          ((this->Type_).neuralnetworkregressor_);
        break;
      case 0x130:
        sVar2 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor>
                          ((this->Type_).bayesianprobitregressor_);
        break;
      default:
        switch(uVar1) {
        case 400:
          sVar2 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::GLMClassifier>
                            ((this->Type_).glmclassifier_);
          break;
        case 0x191:
          sVar2 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::SupportVectorClassifier>
                            ((this->Type_).supportvectorclassifier_);
          break;
        case 0x192:
          sVar2 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleClassifier>
                            ((this->Type_).treeensembleclassifier_);
          break;
        case 0x193:
          sVar2 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkClassifier>
                            ((this->Type_).neuralnetworkclassifier_);
          break;
        case 0x194:
          sVar2 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::KNearestNeighborsClassifier>
                            ((this->Type_).knearestneighborsclassifier_);
          break;
        default:
          if (uVar1 == 3000) {
            sVar2 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::SerializedModel>
                              ((this->Type_).serializedmodel_);
            sVar3 = sVar3 + sVar2 + 3;
            goto switchD_004dcdbf_caseD_25d;
          }
          if (uVar1 == 0xc9) {
            sVar2 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::PipelineRegressor>
                              ((this->Type_).pipelineregressor_);
          }
          else if (uVar1 == 0xca) {
            sVar2 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::Pipeline>((this->Type_).pipeline_);
          }
          else if (uVar1 == 500) {
            sVar2 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::NeuralNetwork>
                              ((this->Type_).neuralnetwork_);
          }
          else if (uVar1 == 0x1f5) {
            sVar2 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::ItemSimilarityRecommender>
                              ((this->Type_).itemsimilarityrecommender_);
          }
          else if (uVar1 == 0x22b) {
            sVar2 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::CustomModel>
                              ((this->Type_).custommodel_);
          }
          else if (uVar1 == 0x22c) {
            sVar2 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::LinkedModel>
                              ((this->Type_).linkedmodel_);
          }
          else if (uVar1 == 900) {
            sVar2 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::Identity>((this->Type_).identity_);
          }
          else {
            if (uVar1 != 200) goto switchD_004dcdbf_caseD_25d;
            sVar2 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::PipelineClassifier>
                              ((this->Type_).pipelineclassifier_);
          }
        }
      }
    }
  }
  sVar3 = sVar3 + sVar2 + 2;
switchD_004dcdbf_caseD_25d:
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t Model::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Model)
  size_t total_size = 0;

  // .CoreML.Specification.ModelDescription description = 2;
  if (this->has_description()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->description_);
  }

  // int32 specificationVersion = 1;
  if (this->specificationversion() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->specificationversion());
  }

  // bool isUpdatable = 10;
  if (this->isupdatable() != 0) {
    total_size += 1 + 1;
  }

  switch (Type_case()) {
    // .CoreML.Specification.PipelineClassifier pipelineClassifier = 200;
    case kPipelineClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.pipelineclassifier_);
      break;
    }
    // .CoreML.Specification.PipelineRegressor pipelineRegressor = 201;
    case kPipelineRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.pipelineregressor_);
      break;
    }
    // .CoreML.Specification.Pipeline pipeline = 202;
    case kPipeline: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.pipeline_);
      break;
    }
    // .CoreML.Specification.GLMRegressor glmRegressor = 300;
    case kGlmRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.glmregressor_);
      break;
    }
    // .CoreML.Specification.SupportVectorRegressor supportVectorRegressor = 301;
    case kSupportVectorRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.supportvectorregressor_);
      break;
    }
    // .CoreML.Specification.TreeEnsembleRegressor treeEnsembleRegressor = 302;
    case kTreeEnsembleRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.treeensembleregressor_);
      break;
    }
    // .CoreML.Specification.NeuralNetworkRegressor neuralNetworkRegressor = 303;
    case kNeuralNetworkRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.neuralnetworkregressor_);
      break;
    }
    // .CoreML.Specification.BayesianProbitRegressor bayesianProbitRegressor = 304;
    case kBayesianProbitRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.bayesianprobitregressor_);
      break;
    }
    // .CoreML.Specification.GLMClassifier glmClassifier = 400;
    case kGlmClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.glmclassifier_);
      break;
    }
    // .CoreML.Specification.SupportVectorClassifier supportVectorClassifier = 401;
    case kSupportVectorClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.supportvectorclassifier_);
      break;
    }
    // .CoreML.Specification.TreeEnsembleClassifier treeEnsembleClassifier = 402;
    case kTreeEnsembleClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.treeensembleclassifier_);
      break;
    }
    // .CoreML.Specification.NeuralNetworkClassifier neuralNetworkClassifier = 403;
    case kNeuralNetworkClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.neuralnetworkclassifier_);
      break;
    }
    // .CoreML.Specification.KNearestNeighborsClassifier kNearestNeighborsClassifier = 404;
    case kKNearestNeighborsClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.knearestneighborsclassifier_);
      break;
    }
    // .CoreML.Specification.NeuralNetwork neuralNetwork = 500;
    case kNeuralNetwork: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.neuralnetwork_);
      break;
    }
    // .CoreML.Specification.ItemSimilarityRecommender itemSimilarityRecommender = 501;
    case kItemSimilarityRecommender: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.itemsimilarityrecommender_);
      break;
    }
    // .CoreML.Specification.CustomModel customModel = 555;
    case kCustomModel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.custommodel_);
      break;
    }
    // .CoreML.Specification.LinkedModel linkedModel = 556;
    case kLinkedModel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.linkedmodel_);
      break;
    }
    // .CoreML.Specification.OneHotEncoder oneHotEncoder = 600;
    case kOneHotEncoder: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.onehotencoder_);
      break;
    }
    // .CoreML.Specification.Imputer imputer = 601;
    case kImputer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.imputer_);
      break;
    }
    // .CoreML.Specification.FeatureVectorizer featureVectorizer = 602;
    case kFeatureVectorizer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.featurevectorizer_);
      break;
    }
    // .CoreML.Specification.DictVectorizer dictVectorizer = 603;
    case kDictVectorizer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.dictvectorizer_);
      break;
    }
    // .CoreML.Specification.Scaler scaler = 604;
    case kScaler: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.scaler_);
      break;
    }
    // .CoreML.Specification.CategoricalMapping categoricalMapping = 606;
    case kCategoricalMapping: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.categoricalmapping_);
      break;
    }
    // .CoreML.Specification.Normalizer normalizer = 607;
    case kNormalizer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.normalizer_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureExtractor arrayFeatureExtractor = 609;
    case kArrayFeatureExtractor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.arrayfeatureextractor_);
      break;
    }
    // .CoreML.Specification.NonMaximumSuppression nonMaximumSuppression = 610;
    case kNonMaximumSuppression: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.nonmaximumsuppression_);
      break;
    }
    // .CoreML.Specification.Identity identity = 900;
    case kIdentity: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.identity_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.TextClassifier textClassifier = 2000;
    case kTextClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.textclassifier_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.WordTagger wordTagger = 2001;
    case kWordTagger: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.wordtagger_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint visionFeaturePrint = 2002;
    case kVisionFeaturePrint: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.visionfeatureprint_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing soundAnalysisPreprocessing = 2003;
    case kSoundAnalysisPreprocessing: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.soundanalysispreprocessing_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.Gazetteer gazetteer = 2004;
    case kGazetteer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.gazetteer_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.WordEmbedding wordEmbedding = 2005;
    case kWordEmbedding: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.wordembedding_);
      break;
    }
    // .CoreML.Specification.SerializedModel serializedModel = 3000;
    case kSerializedModel: {
      total_size += 3 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.serializedmodel_);
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}